

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

void __thiscall deqp::gles31::Functional::UniformCase::~UniformCase(UniformCase *this)

{
  deInt32 *pdVar1;
  pointer puVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  SharedPtrStateBase *pSVar5;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_0215fc00;
  deinit(this);
  puVar2 = (this->m_filledTextureUnits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_filledTextureUnits).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  ppTVar3 = (this->m_texturesCube).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar3 != (pointer)0x0) {
    operator_delete(ppTVar3,(long)(this->m_texturesCube).
                                  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar3
                   );
  }
  ppTVar4 = (this->m_textures2d).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4,(long)(this->m_textures2d).
                                  super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar4
                   );
  }
  pSVar5 = (this->m_uniformCollection).m_state;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar5->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_uniformCollection).m_ptr = (UniformCollection *)0x0;
      (*((this->m_uniformCollection).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_uniformCollection).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar5 = (this->m_uniformCollection).m_state;
      if (pSVar5 != (SharedPtrStateBase *)0x0) {
        (*pSVar5->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_uniformCollection).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  glu::CallLogWrapper::~CallLogWrapper(&this->super_CallLogWrapper);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

UniformCase::~UniformCase (void)
{
	UniformCase::deinit();
}